

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::RegistryAccess::Import(RegistryAccess *this,istream *is)

{
  pointer puVar1;
  long lVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  pointer this_00;
  string local_1f0;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> entries;
  stringstream stream;
  ostream local_1a8 [376];
  
  RegFileParse(&entries,is);
  this_00 = entries.
            super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        entries.
        super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_0012a0e8:
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
                (&entries);
      return (int)(this_00 !=
                  entries.
                  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (this_00->keyLen == 0) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
                 (const_iterator)
                 (this_00->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((entries.
                     super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start)->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )((entries.
                     super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start)->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      puVar1 = (this_00->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = AdsDevice::WriteReqEx
                        (&this->device,
                         (entries.
                          super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start)->hive,0,
                         (long)(this_00->buffer).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,puVar1);
      if (lVar2 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar3 = std::operator<<(local_1a8,"Import");
        poVar3 = std::operator<<(poVar3,"(): failed with: 0x");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::operator<<(poVar3,'\n');
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_1f0);
LAB_0012a0d4:
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        goto LAB_0012a0e8;
      }
    }
    else {
      entries.super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = this_00;
      if (this_00->hive - REG_DELETE_HKEYLOCALMACHINE < 3) {
        puVar1 = (this_00->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = AdsDevice::WriteReqEx
                          (&this->device,this_00->hive,0,
                           (long)(this_00->buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,puVar1);
        if (lVar2 == 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar3 = std::operator<<(local_1a8,"Import");
          poVar3 = std::operator<<(poVar3,"(): failed to delete registry key \"");
          pmVar4 = std::
                   map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)g_HiveMapping_abi_cxx11_,&this_00->hive);
          poVar3 = std::operator<<(poVar3,(pmVar4->_M_dataplus)._M_p + 1);
          poVar3 = std::operator<<(poVar3,(char *)(this_00->buffer).
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar3,"\". It could not be found in the registry of the target.\n");
          std::__cxx11::stringbuf::str();
          Logger::Log(2,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        }
        else if (lVar2 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar3 = std::operator<<(local_1a8,"Import");
          poVar3 = std::operator<<(poVar3,"(): failed to delete registry key \"");
          pmVar4 = std::
                   map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)g_HiveMapping_abi_cxx11_,&this_00->hive);
          poVar3 = std::operator<<(poVar3,(pmVar4->_M_dataplus)._M_p + 1);
          poVar3 = std::operator<<(poVar3,(char *)(this_00->buffer).
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
          poVar3 = std::operator<<(poVar3,"\" with error code: 0x");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::operator<<(poVar3,'\n');
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1f0);
          goto LAB_0012a0d4;
        }
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

int RegistryAccess::Import(std::istream& is) const
{
    constexpr auto SYSTEMSERVICE_REGISTRY_INVALIDKEY = 1;
    auto entries = RegFileParse(is);
    const auto* key = &entries.front();
    for (auto& next: entries) {
        if (next.keyLen) {
            key = &next;
            if (key->IsForDeletion()) {
                const auto status = device.WriteReqEx(key->hive, 0, key->buffer.size(), key->buffer.data());

                switch (status) {
                case ADSERR_NOERR:
                    break; // OK

                case SYSTEMSERVICE_REGISTRY_INVALIDKEY:
                    LOG_WARN(__FUNCTION__
                             << "(): failed to delete registry key \""
                             << (g_HiveMapping.at(key->hive).c_str() + 1)
                             << key->buffer.data()
                             << "\". It could not be found in the registry of the target.\n");
                    break; // OK: The key could not be found. But that is OK, because we wanted to delete it.

                default:
                    LOG_ERROR(__FUNCTION__
                              << "(): failed to delete registry key \""
                              << (g_HiveMapping.at(key->hive).c_str() + 1)
                              << key->buffer.data()
                              << "\" with error code: 0x"
                              << std::hex << status << '\n');
                    return 1;
                }
            }
            continue;
        }

        // Prepend key path before value name
        next.buffer.insert(next.buffer.begin(), key->buffer.cbegin(), key->buffer.cend());
        const auto status = device.WriteReqEx(key->hive, 0, next.buffer.size(), next.buffer.data());
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
    }
    return 0;
}